

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O0

void rpn_HIGH(Expression *expr,Expression *src)

{
  bool bVar1;
  uint8_t *puVar2;
  uint8_t bytes [12];
  Expression *src_local;
  Expression *expr_local;
  
  memcpy(expr,src,0x30);
  expr->isSymbol = false;
  bVar1 = rpn_isKnown(expr);
  if (bVar1) {
    expr->val = (uint)expr->val >> 8 & 0xff;
  }
  else {
    expr->rpnPatchSize = expr->rpnPatchSize + 0xc;
    puVar2 = reserveSpace(expr,0xc);
    puVar2[0] = 0x80;
    puVar2[1] = '\b';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    puVar2[4] = '\0';
    puVar2[5] = 'A';
    puVar2[6] = 0x80;
    puVar2[7] = 0xff;
    puVar2[8] = '\0';
    puVar2[9] = '\0';
    puVar2[10] = '\0';
    puVar2[0xb] = '\x11';
  }
  return;
}

Assistant:

void rpn_HIGH(struct Expression *expr, const struct Expression *src)
{
	*expr = *src;
	expr->isSymbol = false;

	if (rpn_isKnown(expr)) {
		expr->val = (uint32_t)expr->val >> 8 & 0xFF;
	} else {
		uint8_t bytes[] = {RPN_CONST,    8, 0, 0, 0, RPN_SHR,
				   RPN_CONST, 0xFF, 0, 0, 0, RPN_AND};
		expr->rpnPatchSize += sizeof(bytes);
		memcpy(reserveSpace(expr, sizeof(bytes)), bytes, sizeof(bytes));
	}
}